

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heaplist.h
# Opt level: O2

void __thiscall HeapList::AddHeap(HeapList *this,int key)

{
  CFoolHeap *this_00;
  CFoolHeap *local_20;
  
  switch(this->TYPE) {
  case Binomial:
    this_00 = (CFoolHeap *)operator_new(0x10);
    CBinomialHeap::CBinomialHeap((CBinomialHeap *)this_00,key);
    break;
  case Leftist:
    this_00 = (CFoolHeap *)operator_new(0x10);
    CBinaryHeap<CLeftistNode>::CBinaryHeap((CBinaryHeap<CLeftistNode> *)this_00,key);
    break;
  case Skew:
    this_00 = (CFoolHeap *)operator_new(0x10);
    CBinaryHeap<CSkewNode>::CBinaryHeap((CBinaryHeap<CSkewNode> *)this_00,key);
    break;
  case Fool:
    this_00 = (CFoolHeap *)operator_new(0x20);
    CFoolHeap::CFoolHeap(this_00,key);
    break;
  default:
    goto switchD_00109f3e_default;
  }
  local_20 = this_00;
  std::vector<IHeap*,std::allocator<IHeap*>>::emplace_back<IHeap*>
            ((vector<IHeap*,std::allocator<IHeap*>> *)this,(IHeap **)&local_20);
switchD_00109f3e_default:
  return;
}

Assistant:

void AddHeap(int key) {

        switch(TYPE) {
            case Leftist: {
                list_.push_back(new CLeftistHeap(key));
            } break;
            case Binomial: {
                list_.push_back(new CBinomialHeap(key));
            } break;

            case Skew: {
                list_.push_back(new CSkewHeap(key));
            } break;
            case Fool: {
                list_.push_back(new CFoolHeap(key));
            } break;
        }
    }